

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParser
          (ImmutableMessageGenerator *this,Printer *printer)

{
  bool bVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  Printer *in_stack_00000010;
  char *in_stack_00000018;
  Printer *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  char (*in_stack_00000050) [10];
  char **in_stack_00000058;
  char (*in_stack_00000060) [11];
  char *in_stack_00000068;
  Printer *in_stack_00000070;
  Descriptor *in_stack_ffffffffffffffb8;
  Context *in_stack_ffffffffffffffc0;
  
  Descriptor::file(*(Descriptor **)(in_RDI + 8));
  ExposePublicParser((FileDescriptor *)0x53fc03);
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[11],char_const*,char[10],std::__cxx11::string>
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000050,in_stack_00000048);
  io::Printer::Indent((Printer *)0x53fc60);
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_00000020,in_stack_00000018,&in_stack_00000010->variable_delimiter_,
             in_stack_00000008);
  bVar1 = Context::HasGeneratedMethods(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
    io::Printer::Print<char[10],std::__cxx11::string>
              (in_stack_00000020,in_stack_00000018,&in_stack_00000010->variable_delimiter_,
               in_stack_00000008);
  }
  else {
    io::Printer::Indent((Printer *)0x53fcea);
    io::Printer::Print<>(in_stack_00000010,(char *)in_stack_00000008);
    io::Printer::Outdent(in_stack_00000020);
  }
  io::Printer::Print<>(in_stack_00000010,(char *)in_stack_00000008);
  io::Printer::Outdent(in_stack_00000020);
  io::Printer::Print<>(in_stack_00000010,(char *)in_stack_00000008);
  Descriptor::name_abi_cxx11_(*(Descriptor **)(in_RDI + 8));
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_00000020,in_stack_00000018,&in_stack_00000010->variable_delimiter_,
             in_stack_00000008);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "$visibility$ static final com.google.protobuf.Parser<$classname$>\n"
      "    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n",
      "visibility",
      ExposePublicParser(descriptor_->file()) ? "@java.lang.Deprecated public"
                                              : "private",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ parsePartialFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print("  return new $classname$(input, extensionRegistry);\n",
                   "classname", descriptor_->name());
  } else {
    // When parsing constructor isn't generated, use builder to parse
    // messages. Note, will fallback to use reflection based mergeFieldFrom()
    // in AbstractMessage.Builder.
    printer->Indent();
    printer->Print(
        "Builder builder = newBuilder();\n"
        "try {\n"
        "  builder.mergeFrom(input, extensionRegistry);\n"
        "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
        "  throw e.setUnfinishedMessage(builder.buildPartial());\n"
        "} catch (java.io.IOException e) {\n"
        "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
        "      e.getMessage()).setUnfinishedMessage(\n"
        "          builder.buildPartial());\n"
        "}\n"
        "return builder.buildPartial();\n");
    printer->Outdent();
  }
  printer->Print("}\n");
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  printer->Print(
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}